

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constpool.cpp
# Opt level: O1

void __thiscall asmjit::ConstPool::fill(ConstPool *this,void *dst)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  Node *pNVar4;
  byte *pbVar5;
  ulong uVar6;
  size_t *extraout_RDX;
  ulong uVar7;
  byte *pbVar8;
  Node *pNVar9;
  Node *pNVar10;
  Node *pNVar11;
  Node *__src;
  undefined8 *__dest;
  ulong uVar12;
  ulong *puVar13;
  uintptr_t uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  size_t __n;
  Node *pNVar18;
  bool bVar19;
  bool bVar20;
  CpuInfo CStack_330;
  code *pcStack_298;
  undefined1 uStack_289;
  undefined8 *puStack_288;
  Node *pNStack_280;
  size_t *psStack_278;
  Node NStack_270;
  void *pvStack_258;
  long lStack_250;
  long lStack_248;
  Tree *pTStack_240;
  size_t sStack_238;
  Node *pNStack_230;
  ulong local_228 [63];
  
  lVar16 = 0;
  __src = (Node *)0x0;
  pNStack_230 = (Node *)0x117cc7;
  __dest = (undefined8 *)dst;
  memset(dst,0,this->_size);
  __n = 1;
  do {
    pNVar11 = this->_tree[lVar16]._tree._root;
    if (pNVar11 != (Node *)0x0) {
      lVar17 = 0;
      do {
        pNVar4 = (Node *)((pNVar11->super_ZoneTreeNodeT<asmjit::ConstPool::Node>).super_ZoneTreeNode
                          ._rbNodeData[0] & 0xfffffffffffffffe);
        if (pNVar4 == (Node *)0x0) {
          while( true ) {
            if ((pNVar11->field_0x10 & 1) == 0) {
              __dest = (undefined8 *)((ulong)pNVar11->_offset + (long)dst);
              __src = pNVar11 + 1;
              pNStack_230 = (Node *)0x117d1e;
              memcpy(__dest,__src,__n);
            }
            pNVar4 = (Node *)(pNVar11->super_ZoneTreeNodeT<asmjit::ConstPool::Node>).
                             super_ZoneTreeNode._rbNodeData[1];
            if (pNVar4 != (Node *)0x0) {
              iVar1 = 0;
              goto LAB_00117d3b;
            }
            bVar19 = lVar17 == 0;
            lVar17 = lVar17 + -1;
            if (bVar19) break;
            pNVar11 = (Node *)local_228[lVar17];
          }
          iVar1 = 1;
          lVar17 = 0;
          pNVar4 = (Node *)0x0;
        }
        else {
          if (lVar17 == 0x3e) {
            pNStack_230 = (Node *)0x117d67;
            fill();
            pNStack_230 = pNVar11;
            sStack_238 = __n;
            pTStack_240 = this->_tree;
            lStack_248 = lVar17;
            lStack_250 = lVar16;
            pvStack_258 = dst;
            uVar6 = (__src->super_ZoneTreeNodeT<asmjit::ConstPool::Node>).super_ZoneTreeNode.
                    _rbNodeData[0];
            if (uVar6 < 2) {
              if ((__src->super_ZoneTreeNodeT<asmjit::ConstPool::Node>).super_ZoneTreeNode.
                  _rbNodeData[1] == 0) {
                if (uVar6 == 0) {
                  pNVar11 = (Node *)*__dest;
                  if (pNVar11 == (Node *)0x0) {
                    *__dest = __src;
                  }
                  else {
                    pNVar4 = &NStack_270;
                    NStack_270.super_ZoneTreeNodeT<asmjit::ConstPool::Node>.super_ZoneTreeNode.
                    _rbNodeData[0] = 0;
                    NStack_270.super_ZoneTreeNodeT<asmjit::ConstPool::Node>.super_ZoneTreeNode.
                    _rbNodeData[1] = (uintptr_t)pNVar11;
                    (__src->super_ZoneTreeNodeT<asmjit::ConstPool::Node>).super_ZoneTreeNode.
                    _rbNodeData[0] = 1;
                    pNStack_280 = __src + 1;
                    uVar6 = 0;
                    uVar7 = 0;
                    pNVar9 = (Node *)0x0;
                    pNVar18 = (Node *)0x0;
                    puStack_288 = __dest;
                    psStack_278 = extraout_RDX;
                    while( true ) {
                      uVar3 = uVar6;
                      if (pNVar11 == (Node *)0x0) {
                        (pNVar18->super_ZoneTreeNodeT<asmjit::ConstPool::Node>).super_ZoneTreeNode.
                        _rbNodeData[uVar3] =
                             (ulong)((uint)(pNVar18->super_ZoneTreeNodeT<asmjit::ConstPool::Node>).
                                           super_ZoneTreeNode._rbNodeData[uVar3] & 1) | (ulong)__src
                        ;
                        pNVar10 = __src;
                      }
                      else {
                        uVar6 = (pNVar11->super_ZoneTreeNodeT<asmjit::ConstPool::Node>).
                                super_ZoneTreeNode._rbNodeData[0];
                        pbVar5 = (byte *)(uVar6 & 0xfffffffffffffffe);
                        pNVar10 = pNVar11;
                        if ((((pbVar5 != (byte *)0x0) && ((*pbVar5 & 1) != 0)) &&
                            (pbVar8 = (byte *)(pNVar11->super_ZoneTreeNodeT<asmjit::ConstPool::Node>
                                              ).super_ZoneTreeNode._rbNodeData[1],
                            pbVar8 != (byte *)0x0)) && ((*pbVar8 & 1) != 0)) {
                          (pNVar11->super_ZoneTreeNodeT<asmjit::ConstPool::Node>).super_ZoneTreeNode
                          ._rbNodeData[0] = uVar6 | 1;
                          *pbVar5 = *pbVar5 & 0xfe;
                          puVar13 = (ulong *)(pNVar11->super_ZoneTreeNodeT<asmjit::ConstPool::Node>)
                                             .super_ZoneTreeNode._rbNodeData[1];
                          *puVar13 = *puVar13 & 0xfffffffffffffffe;
                        }
                      }
                      if (((pNVar18 != (Node *)0x0) &&
                          (((pNVar10->super_ZoneTreeNodeT<asmjit::ConstPool::Node>).
                            super_ZoneTreeNode._rbNodeData[0] & 1) != 0)) &&
                         (((pNVar18->super_ZoneTreeNodeT<asmjit::ConstPool::Node>).
                           super_ZoneTreeNode._rbNodeData[0] & 1) != 0)) {
                        bVar20 = pNVar9 == (Node *)(pNVar4->
                                                  super_ZoneTreeNodeT<asmjit::ConstPool::Node>).
                                                  super_ZoneTreeNode._rbNodeData[1];
                        uVar12 = (ulong)(uVar7 == 0);
                        bVar19 = uVar7 != 0;
                        uVar6 = (pNVar9->super_ZoneTreeNodeT<asmjit::ConstPool::Node>).
                                super_ZoneTreeNode._rbNodeData[bVar19];
                        pbVar5 = (byte *)(uVar6 & 0xfffffffffffffffe);
                        if (pNVar10 ==
                            (Node *)((pNVar18->super_ZoneTreeNodeT<asmjit::ConstPool::Node>).
                                     super_ZoneTreeNode._rbNodeData[uVar7] & 0xfffffffffffffffe)) {
                          puVar13 = (ulong *)(pbVar5 + uVar12 * 8);
                          uVar14 = (ulong)((uint)uVar6 & 1) | *puVar13 & 0xfffffffffffffffe;
                        }
                        else {
                          pbVar8 = (byte *)(*(ulong *)(pbVar5 + (ulong)(uVar7 == 0) * 8) &
                                           0xfffffffffffffffe);
                          uVar15 = (ulong)((uint)bVar19 * 8);
                          *(ulong *)(pbVar5 + (ulong)(uVar7 == 0) * 8) =
                               (ulong)((uint)*(ulong *)(pbVar5 + (ulong)(uVar7 == 0) * 8) & 1) |
                               *(ulong *)(pbVar8 + uVar15) & 0xfffffffffffffffe;
                          *(ulong *)(pbVar8 + uVar15) =
                               (ulong)((uint)*(undefined8 *)(pbVar8 + uVar15) & 1) | (ulong)pbVar5;
                          *pbVar5 = *pbVar5 | 1;
                          *pbVar8 = *pbVar8 & 0xfe;
                          uVar6 = (ulong)((uint)*(undefined8 *)
                                                 ((long)(pNVar9->
                                                  super_ZoneTreeNodeT<asmjit::ConstPool::Node>).
                                                  super_ZoneTreeNode._rbNodeData + uVar15) & 1);
                          *(byte **)((long)(pNVar9->super_ZoneTreeNodeT<asmjit::ConstPool::Node>).
                                           super_ZoneTreeNode._rbNodeData + uVar15) = pbVar8 + uVar6
                          ;
                          puVar13 = (ulong *)(pbVar8 + uVar12 * 8);
                          uVar14 = *puVar13 & 0xfffffffffffffffe | uVar6;
                          pbVar5 = pbVar8;
                          uStack_289 = bVar20;
                        }
                        (pNVar9->super_ZoneTreeNodeT<asmjit::ConstPool::Node>).super_ZoneTreeNode.
                        _rbNodeData[bVar19] = uVar14;
                        *puVar13 = (ulong)((uint)*puVar13 & 1) | (ulong)pNVar9;
                        *(byte *)(pNVar9->super_ZoneTreeNodeT<asmjit::ConstPool::Node>).
                                 super_ZoneTreeNode._rbNodeData =
                             (byte)(pNVar9->super_ZoneTreeNodeT<asmjit::ConstPool::Node>).
                                   super_ZoneTreeNode._rbNodeData[0] | 1;
                        *pbVar5 = *pbVar5 & 0xfe;
                        (pNVar4->super_ZoneTreeNodeT<asmjit::ConstPool::Node>).super_ZoneTreeNode.
                        _rbNodeData[bVar20] =
                             (ulong)((uint)(pNVar4->super_ZoneTreeNodeT<asmjit::ConstPool::Node>).
                                           super_ZoneTreeNode._rbNodeData[bVar20] & 1) |
                             (ulong)pbVar5;
                      }
                      if (pNVar10 == __src) break;
                      pcStack_298 = (code *)0x117f40;
                      uVar2 = memcmp(pNVar10 + 1,pNStack_280,*psStack_278);
                      if (pNVar9 != (Node *)0x0) {
                        pNVar4 = pNVar9;
                      }
                      pNVar11 = (Node *)((pNVar10->super_ZoneTreeNodeT<asmjit::ConstPool::Node>).
                                         super_ZoneTreeNode._rbNodeData[uVar2 >> 0x1f] &
                                        0xfffffffffffffffe);
                      uVar6 = (ulong)(uVar2 >> 0x1f);
                      uVar7 = uVar3;
                      pNVar9 = pNVar18;
                      pNVar18 = pNVar10;
                    }
                    *puStack_288 = NStack_270.super_ZoneTreeNodeT<asmjit::ConstPool::Node>.
                                   super_ZoneTreeNode._rbNodeData[1];
                    *(byte *)(((ZoneTreeNodeT<asmjit::ConstPool::Node> *)
                              NStack_270.super_ZoneTreeNodeT<asmjit::ConstPool::Node>.
                              super_ZoneTreeNode._rbNodeData[1])->super_ZoneTreeNode)._rbNodeData =
                         (byte)(((ZoneTreeNodeT<asmjit::ConstPool::Node> *)
                                NStack_270.super_ZoneTreeNodeT<asmjit::ConstPool::Node>.
                                super_ZoneTreeNode._rbNodeData[1])->super_ZoneTreeNode)._rbNodeData
                               [0] & 0xfe;
                  }
                  return;
                }
                goto LAB_00117f8f;
              }
            }
            else {
              pcStack_298 = (code *)0x117f8a;
              ZoneTree<asmjit::ConstPool::Node>::insert<asmjit::ConstPool::Compare>();
            }
            pcStack_298 = (code *)0x117f8f;
            ZoneTree<asmjit::ConstPool::Node>::insert<asmjit::ConstPool::Compare>();
LAB_00117f8f:
            pcStack_298 = CpuInfo::host;
            ZoneTree<asmjit::ConstPool::Node>::insert<asmjit::ConstPool::Compare>();
            if (cpuInfoInitialized == '\0') {
              pcStack_298 = (code *)dst;
              memset(&CStack_330,0,0x98);
              x86::detectCpu(&CStack_330);
              lVar16 = sysconf(0x54);
              CStack_330._hwThreadCount = 1;
              if (1 < lVar16) {
                CStack_330._hwThreadCount = (uint32_t)lVar16;
              }
              memcpy(cpuInfoGlobal,&CStack_330,0x98);
              cpuInfoInitialized = '\x01';
            }
            return;
          }
          local_228[lVar17] = (ulong)pNVar11;
          lVar17 = lVar17 + 1;
          iVar1 = 3;
        }
LAB_00117d3b:
        pNVar11 = pNVar4;
      } while ((iVar1 == 0) || (iVar1 == 3));
    }
    __n = __n * 2;
    lVar16 = lVar16 + 1;
    if (lVar16 == 6) {
      return;
    }
  } while( true );
}

Assistant:

void ConstPool::fill(void* dst) const noexcept {
  // Clears possible gaps, asmjit should never emit garbage to the output.
  memset(dst, 0, _size);

  ConstPoolFill filler(static_cast<uint8_t*>(dst), 1);
  for (size_t i = 0; i < ASMJIT_ARRAY_SIZE(_tree); i++) {
    _tree[i].forEach(filler);
    filler._dataSize <<= 1;
  }
}